

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O0

Matrix33<float> * __thiscall Imath_3_2::Matrix33<float>::operator=(Matrix33<float> *this,float a)

{
  float a_local;
  Matrix33<float> *this_local;
  
  this->x[0][0] = a;
  this->x[0][1] = a;
  this->x[0][2] = a;
  this->x[1][0] = a;
  this->x[1][1] = a;
  this->x[1][2] = a;
  this->x[2][0] = a;
  this->x[2][1] = a;
  this->x[2][2] = a;
  return this;
}

Assistant:

const Matrix33<T>&
Matrix33<T>::operator= (T a) IMATH_NOEXCEPT
{
    x[0][0] = a;
    x[0][1] = a;
    x[0][2] = a;
    x[1][0] = a;
    x[1][1] = a;
    x[1][2] = a;
    x[2][0] = a;
    x[2][1] = a;
    x[2][2] = a;
    return *this;
}